

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::regenerateMipMapLevels
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,void *data,u32 layer)

{
  COpenGL3CacheHandler *pCVar1;
  STextureCache *this_00;
  long in_RSI;
  COpenGL3ExtensionHandler *in_RDI;
  u32 level;
  u32 dataSize;
  u8 *tmpData;
  u32 height;
  u32 width;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *prevTexture;
  u32 in_stack_0000004c;
  u32 in_stack_00000050;
  undefined4 in_stack_00000054;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *in_stack_00000058;
  undefined3 uVar2;
  u32 in_stack_ffffffffffffffbc;
  uint local_28;
  uint local_24;
  
  if (((((ulong)(in_RDI->Extensions)._M_h._M_before_begin._M_nxt & 1) != 0) &&
      ((in_RDI[1].super_COGLESCoreExtensionHandler.FeatureAvailable[0x10] & 1U) == 0)) &&
     ((1 < *(uint *)((in_RDI->super_COGLESCoreExtensionHandler).FeatureAvailable + 0x17) ||
      (1 < *(uint *)&(in_RDI->super_COGLESCoreExtensionHandler).field_0x54)))) {
    pCVar1 = COpenGL3DriverBase::getCacheHandler
                       (*(COpenGL3DriverBase **)&(in_RDI->Extensions)._M_h._M_rehash_policy);
    this_00 = COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              ::getTextureCache(pCVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::get(this_00,0);
    pCVar1 = COpenGL3DriverBase::getCacheHandler
                       (*(COpenGL3DriverBase **)&(in_RDI->Extensions)._M_h._M_rehash_policy);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::getTextureCache(pCVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              ((STextureCache *)CONCAT44(in_stack_00000054,in_stack_00000050),in_stack_0000004c,
               &this->super_ITexture,data._4_4_);
    if (in_RSI == 0) {
      COpenGL3ExtensionHandler::irrGlGenerateMipmap(in_RDI,in_stack_ffffffffffffffbc);
    }
    else {
      local_24 = *(uint *)((in_RDI->super_COGLESCoreExtensionHandler).FeatureAvailable + 0x17);
      local_28 = *(uint *)&(in_RDI->super_COGLESCoreExtensionHandler).field_0x54;
      do {
        if (1 < local_24) {
          local_24 = local_24 >> 1;
        }
        if (1 < local_28) {
          local_28 = local_28 >> 1;
        }
        IImage::getDataSizeFromFormat
                  ((ECOLOR_FORMAT)((ulong)in_RDI >> 0x20),(u32)in_RDI,in_stack_ffffffffffffffbc);
        uploadTexture(in_stack_00000058,in_stack_00000054._3_1_,in_stack_00000050,in_stack_0000004c,
                      this);
        uVar2 = (undefined3)in_stack_ffffffffffffffbc;
        in_stack_ffffffffffffffbc = CONCAT13(1,uVar2);
        if (local_24 == 1) {
          in_stack_ffffffffffffffbc = CONCAT13(local_28 != 1,uVar2);
        }
      } while ((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0');
    }
    pCVar1 = COpenGL3DriverBase::getCacheHandler
                       (*(COpenGL3DriverBase **)&(in_RDI->Extensions)._M_h._M_rehash_policy);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::getTextureCache(pCVar1);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              ((STextureCache *)CONCAT44(in_stack_00000054,in_stack_00000050),in_stack_0000004c,
               &this->super_ITexture,data._4_4_);
  }
  return;
}

Assistant:

void regenerateMipMapLevels(void *data = 0, u32 layer = 0) override
	{
		if (!HasMipMaps || LegacyAutoGenerateMipMaps || (Size.Width <= 1 && Size.Height <= 1))
			return;

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		if (data) {
			u32 width = Size.Width;
			u32 height = Size.Height;
			u8 *tmpData = static_cast<u8 *>(data);
			u32 dataSize = 0;
			u32 level = 0;

			do {
				if (width > 1)
					width >>= 1;

				if (height > 1)
					height >>= 1;

				dataSize = IImage::getDataSizeFromFormat(ColorFormat, width, height);
				++level;

				uploadTexture(true, layer, level, tmpData);

				tmpData += dataSize;
			} while (width != 1 || height != 1);
		} else {
			Driver->irrGlGenerateMipmap(TextureType);
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
	}